

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

prsndef * prsnew3(prscxdef *ctx,int t,prsndef *n1,prsndef *n2,prsndef *n3)

{
  prsndef *ppVar1;
  
  if (0x1f < ctx->prscxnrem) {
    ppVar1 = (prsndef *)ctx->prscxnode;
    ctx->prscxnrem = ctx->prscxnrem - 0x20;
    ctx->prscxnode = (uchar *)((long)&ppVar1->prsnv + 0x18);
    ppVar1->prsntyp = t;
    ppVar1->prsnnlf = 3;
    (ppVar1->prsnv).prsnvn[0] = n1;
    (ppVar1->prsnv).prsnvn[1] = n2;
    (ppVar1->prsnv).prsnvn[2] = n3;
    return ppVar1;
  }
  errsigf(ctx->prscxerr,"TADS",0x131);
}

Assistant:

prsndef *prsnew3(prscxdef *ctx, int t, prsndef *n1, prsndef *n2, prsndef *n3)
{
    prsndef *n = prsalo(ctx, 3);
    
    n->prsntyp = t;
    n->prsnnlf = 3;
    n->prsnv.prsnvn[0] = n1;
    n->prsnv.prsnvn[1] = n2;
    n->prsnv.prsnvn[2] = n3;
    return(n);
}